

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

bool __thiscall QRenderRule::hasNativeBorder(QRenderRule *this)

{
  long lVar1;
  bool bVar2;
  QStyleSheetBorderData *pQVar3;
  long in_FS_OFFSET;
  nullptr_t *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::operator==((QSharedDataPointer<QStyleSheetBorderData> *)
                       CONCAT17(in_stack_ffffffffffffffd7,
                                CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)),
                       in_stack_ffffffffffffffc8);
  local_19 = true;
  if (!bVar2) {
    QSharedDataPointer<QStyleSheetBorderData>::operator->
              ((QSharedDataPointer<QStyleSheetBorderData> *)0x44a0e7);
    bVar2 = QStyleSheetBorderData::hasBorderImage
                      ((QStyleSheetBorderData *)
                       CONCAT17(in_stack_ffffffffffffffd7,
                                CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)));
    local_19 = false;
    if (!bVar2) {
      pQVar3 = QSharedDataPointer<QStyleSheetBorderData>::operator->
                         ((QSharedDataPointer<QStyleSheetBorderData> *)0x44a10a);
      local_19 = pQVar3->styles[0] == BorderStyle_Native;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool hasNativeBorder() const {
        return bd == nullptr
               || (!bd->hasBorderImage() && bd->styles[0] == BorderStyle_Native);
    }